

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_comm_get_attr_
               (MPIABI_Fint *comm,MPIABI_Fint *comm_keyval,void *attribute_val,int *flag,
               MPIABI_Fint *ierror)

{
  MPIABI_Fint *ierror_local;
  int *flag_local;
  void *attribute_val_local;
  MPIABI_Fint *comm_keyval_local;
  MPIABI_Fint *comm_local;
  
  mpi_comm_get_attr_(comm,comm_keyval,attribute_val,flag,ierror);
  return;
}

Assistant:

void mpiabi_comm_get_attr_(
  const MPIABI_Fint * comm,
  const MPIABI_Fint * comm_keyval,
  void * attribute_val,
  int * flag,
  MPIABI_Fint * ierror
) {
  return mpi_comm_get_attr_(
    comm,
    comm_keyval,
    attribute_val,
    flag,
    ierror
  );
}